

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_util.h
# Opt level: O2

void google::protobuf::
     STLDeleteElements<std::vector<google::protobuf::FileDescriptorProto_const*,std::allocator<google::protobuf::FileDescriptorProto_const*>>>
               (vector<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>
                *container)

{
  pointer ppFVar1;
  
  if (container !=
      (vector<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>
       *)0x0) {
    STLDeleteContainerPointers<__gnu_cxx::__normal_iterator<google::protobuf::FileDescriptorProto_const**,std::vector<google::protobuf::FileDescriptorProto_const*,std::allocator<google::protobuf::FileDescriptorProto_const*>>>>
              ((__normal_iterator<const_google::protobuf::FileDescriptorProto_**,_std::vector<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>_>
                )(container->
                 super__Vector_base<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>
                 )._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_google::protobuf::FileDescriptorProto_**,_std::vector<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>_>
                )(container->
                 super__Vector_base<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
    ppFVar1 = (container->
              super__Vector_base<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((container->
        super__Vector_base<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>
        )._M_impl.super__Vector_impl_data._M_finish != ppFVar1) {
      (container->
      super__Vector_base<const_google::protobuf::FileDescriptorProto_*,_std::allocator<const_google::protobuf::FileDescriptorProto_*>_>
      )._M_impl.super__Vector_impl_data._M_finish = ppFVar1;
    }
  }
  return;
}

Assistant:

void STLDeleteElements(T *container) {
  if (!container) return;
  STLDeleteContainerPointers(container->begin(), container->end());
  container->clear();
}